

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  pointer *ppbVar1;
  cmLocalGenerator *pcVar2;
  cmSourceFile *this_00;
  string_view sVar3;
  string_view str;
  CbpUnit *this_01;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  __type _Var7;
  TargetType TVar8;
  const_reference ppcVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_02;
  pointer this_03;
  reference pbVar10;
  string *psVar11;
  string *__rhs;
  cmake *pcVar12;
  reference ppcVar13;
  cmMakefile *pcVar14;
  GeneratorTargetVector *pGVar15;
  pointer pcVar16;
  reference ppcVar17;
  cmMakefile *this_04;
  long lVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar19;
  mapped_type *pmVar20;
  mapped_type *this_05;
  reference ppcVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  allocator<char> local_a99;
  string local_a98;
  cmGeneratorTarget *local_a78;
  cmGeneratorTarget *tgt;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2_5;
  string local_a50;
  CbpUnit *local_a30;
  CbpUnit *unit;
  string *unitFilename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>
  *s_1;
  iterator __end1_4;
  iterator __begin1_4;
  all_files_map_t *__range1_4;
  _Self local_9f8;
  char local_9e9;
  undefined1 local_9e8 [8];
  string hname;
  string *ext;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_4;
  char local_981;
  string local_980;
  undefined1 local_960 [8];
  string headerBasename;
  string *fileName_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headerExts;
  mapped_type *local_910;
  CbpUnit *cbpUnit;
  string local_900;
  undefined1 local_8d9;
  undefined1 local_8d8 [7];
  bool excludeExternal_1;
  string relative_1;
  string *fullPath;
  string *srcext;
  string lang;
  bool isCFile;
  cmSourceFile *s;
  iterator __end4;
  iterator __begin4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range4;
  string local_848;
  undefined1 local_828 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  GeneratorTargetVector *__range2_3;
  GeneratorTargetVector *targets_1;
  cmMakefile *makefile;
  cmLocalGenerator *lg_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_2;
  cmake *cm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  all_files_map_t allFiles;
  string fastTarget;
  cmGeneratorTarget *gt;
  undefined1 local_718 [8];
  string targetName;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  GeneratorTargetVector *__range2_2;
  GeneratorTargetVector *targets;
  cmLocalGenerator *lg_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_1;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  int local_638;
  allocator<char> local_631;
  string local_630;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  int local_59c [2];
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  undefined1 local_548 [8];
  cmXMLWriter xml;
  string local_4e8;
  string *local_4c8;
  string *makeArgs;
  string local_4b8;
  string *local_498;
  string *make;
  string compiler;
  string local_468;
  byte local_441;
  iterator iStack_440;
  bool excludeExternal;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  const_iterator local_430;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  const_iterator local_418;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_408;
  undefined1 local_400 [8];
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split;
  string *relative;
  string *listFile;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  cmLocalGenerator *lg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  Tree tree;
  undefined1 local_290 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  ppcVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  fout._608_8_ = cmLocalGenerator::GetMakefile(*ppcVar9);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,filename,false,None);
  bVar5 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar5 & 1) == 0) {
    Tree::Tree((Tree *)&__range1);
    this_02 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
             ::begin(this_02);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
            ::end(this_02);
    while (bVar6 = std::operator!=(&__end1,(_Self *)&it), bVar6) {
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
            ::operator*(&__end1)->first;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      this_03 = listFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      __end2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                         ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this_03
                         );
      lg = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                     ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this_03);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                         *)&lg), bVar6) {
        ppcVar13 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&__end2);
        pcVar14 = cmLocalGenerator::GetMakefile(*ppcVar13);
        pvVar19 = cmMakefile::GetListFiles_abi_cxx11_(pcVar14);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,pvVar19);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
      listFile = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&listFile), bVar6) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar10);
        psVar11 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        sVar3 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
        bVar6 = cmHasPrefix(str,sVar3);
        if (!bVar6) {
          ppcVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                              ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                               (listFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),0);
          psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(*ppcVar9);
          cmSystemTools::RelativePath
                    ((string *)
                     &split.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar11,pbVar10);
          ppbVar1 = &split.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar19 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&fileName.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(pvVar19);
          cmsys::SystemTools::SplitPath((string *)ppbVar1,pvVar19,false);
          local_410._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&fileName.field_2 + 8));
          local_408 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_410,1);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_408);
          std::__cxx11::string::string((string *)local_400,(string *)pbVar10);
          pvVar19 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(&fileName.field_2._M_allocated_capacity + 1);
          local_428._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar19);
          local_420 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_428,1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_418,&local_420);
          local_438._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar19);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_430,&local_438);
          iStack_440 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::erase(pvVar19,local_418,local_430);
          ppcVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                              ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                               (listFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),0);
          pcVar14 = cmLocalGenerator::GetMakefile(*ppcVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_468,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                     (allocator<char> *)(compiler.field_2._M_local_buf + 0xf));
          bVar6 = cmMakefile::IsOn(pcVar14,&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator((allocator<char> *)(compiler.field_2._M_local_buf + 0xf))
          ;
          local_441 = bVar6;
          bVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&fileName.field_2 + 8));
          if ((!bVar6) &&
             ((((local_441 & 1) == 0 ||
               (lVar18 = std::__cxx11::string::find((char *)ppbVar1,0x1288bac), lVar18 == -1)) &&
              (lVar18 = std::__cxx11::string::find((char *)ppbVar1,0x1236132), lVar18 == -1)))) {
            Tree::InsertPath((Tree *)&__range1,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&fileName.field_2 + 8),1,(string *)local_400);
          }
          std::__cxx11::string::~string((string *)local_400);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&fileName.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)
                     &split.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
      ::operator++(&__end1);
    }
    GetCBCompilerId_abi_cxx11_((string *)&make,this,(cmMakefile *)fout._608_8_);
    uVar4 = fout._608_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"CMAKE_MAKE_PROGRAM",(allocator<char> *)((long)&makeArgs + 7));
    psVar11 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar4,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&makeArgs + 7));
    uVar4 = fout._608_8_;
    local_498 = psVar11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",
               (allocator<char> *)&xml.field_0x57);
    psVar11 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    local_4c8 = psVar11;
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_548,(ostream *)local_290,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_548,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"CodeBlocks_project_file",&local_569);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"FileVersion",&local_591);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    local_59c[1] = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_548,"major",local_59c + 1);
    local_59c[0] = 6;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_548,"minor",local_59c);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"Project",&local_5c1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"Option",&local_5e9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator(&local_5e9);
    ppcVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_610,*ppcVar9);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_548,"title",&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Option",&local_631);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
    local_638 = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_548,"makefile_is_custom",&local_638);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"Option",&local_659);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_548,"compiler",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&make);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    Tree::BuildVirtualFolder((Tree *)&__range1,(cmXMLWriter *)local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"Build",&local_681);
    cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"all",(allocator<char> *)((long)&__range1_1 + 7));
    psVar11 = local_498;
    ppcVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    AppendTarget(this,(cmXMLWriter *)local_548,&local_6a8,(cmGeneratorTarget *)0x0,psVar11,*ppcVar9,
                 (string *)&make,local_4c8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    __end1_1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    lg_1 = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                               *)&lg_1), bVar6) {
      ppcVar13 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&__end1_1);
      pcVar2 = *ppcVar13;
      pGVar15 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
      __end2_2 = std::
                 vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ::begin(pGVar15);
      target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
               std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::end(pGVar15);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                 *)&target), bVar6) {
        targetName.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
             ::operator*(&__end2_2);
        pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                  operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              *)targetName.field_2._8_8_);
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar16);
        std::__cxx11::string::string((string *)local_718,(string *)psVar11);
        pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                  operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              *)targetName.field_2._8_8_);
        TVar8 = cmGeneratorTarget::GetType(pcVar16);
        if (TVar8 < UTILITY) {
          pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)targetName.field_2._8_8_);
          AppendTarget(this,(cmXMLWriter *)local_548,(string *)local_718,pcVar16,local_498,pcVar2,
                       (string *)&make,local_4c8);
          cmStrCat<std::__cxx11::string&,char_const(&)[6]>
                    ((string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_718,
                     (char (*) [6])0x1288bb9);
          AppendTarget(this,(cmXMLWriter *)local_548,
                       (string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar16,
                       local_498,pcVar2,(string *)&make,local_4c8);
          std::__cxx11::string::~string
                    ((string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else if (TVar8 == UTILITY) {
          sVar3 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_718);
          bVar6 = cmHasLiteralPrefix<8ul>(sVar3,(char (*) [8])0x1220766);
          if ((!bVar6) ||
             (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_718,"Nightly"), !bVar6)) {
            sVar3 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_718);
            bVar6 = cmHasLiteralPrefix<11ul>(sVar3,(char (*) [11])0x1220662);
            if ((!bVar6) ||
               (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_718,"Continuous"), !bVar6)) {
              sVar3 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_718);
              bVar6 = cmHasLiteralPrefix<13ul>(sVar3,(char (*) [13])0x12206e1);
              if ((!bVar6) ||
                 (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_718,"Experimental"), !bVar6)) {
                AppendTarget(this,(cmXMLWriter *)local_548,(string *)local_718,
                             (cmGeneratorTarget *)0x0,local_498,pcVar2,(string *)&make,local_4c8);
              }
            }
          }
        }
        else if (TVar8 == GLOBAL_TARGET) {
          psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
          __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar2);
          _Var7 = std::operator==(psVar11,__rhs);
          if (_Var7) {
            AppendTarget(this,(cmXMLWriter *)local_548,(string *)local_718,(cmGeneratorTarget *)0x0,
                         local_498,pcVar2,(string *)&make,local_4c8);
          }
        }
        std::__cxx11::string::~string((string *)local_718);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
        ::operator++(&__end2_2);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&__end1_1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
           *)&cFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cm);
    pcVar12 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    __end1_2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    lg_2 = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                               *)&lg_2), bVar6) {
      ppcVar13 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&__end1_2);
      pcVar2 = *ppcVar13;
      pcVar14 = cmLocalGenerator::GetMakefile(pcVar2);
      pGVar15 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
      __end2_3 = std::
                 vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ::begin(pGVar15);
      target_1 = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 std::
                 vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ::end(pGVar15);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                 *)&target_1), bVar6) {
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                      ::operator*(&__end2_3);
        pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                  operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              *)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        TVar8 = cmGeneratorTarget::GetType(pcVar16);
        if (TVar8 < GLOBAL_TARGET) {
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_828);
          pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                    operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)sources.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&__range4 + 7));
          psVar11 = cmMakefile::GetSafeDefinition(pcVar14,&local_848);
          cmGeneratorTarget::GetSourceFiles
                    (pcVar16,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_828,
                     psVar11);
          std::__cxx11::string::~string((string *)&local_848);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          __end4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                             ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_828);
          s = (cmSourceFile *)
              std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                        ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_828);
          while (bVar6 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                             *)&s), bVar6) {
            ppcVar17 = __gnu_cxx::
                       __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                       ::operator*(&__end4);
            this_00 = *ppcVar17;
            pcVar16 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                      operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  *)sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            TVar8 = cmGeneratorTarget::GetType(pcVar16);
            if ((TVar8 != UTILITY) ||
               (bVar6 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal), !bVar6)) {
              lang.field_2._M_local_buf[0xf] = '\0';
              psVar11 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(this_00);
              std::__cxx11::string::string((string *)&srcext,(string *)psVar11);
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&srcext,"C");
              if ((bVar6) ||
                 (((bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&srcext,"CXX"), bVar6 ||
                   (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&srcext,"CUDA"), bVar6)) ||
                  (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&srcext,"HIP"), bVar6)))) {
                psVar11 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                sVar3 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar11);
                lang.field_2._M_local_buf[0xf] = cmake::IsACLikeSourceExtension(pcVar12,sVar3);
              }
              relative_1.field_2._8_8_ =
                   cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
              psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar2);
              cmSystemTools::RelativePath
                        ((string *)local_8d8,psVar11,(string *)relative_1.field_2._8_8_);
              this_04 = cmLocalGenerator::GetMakefile(pcVar2);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_900,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                         (allocator<char> *)((long)&cbpUnit + 7));
              bVar6 = cmMakefile::IsOn(this_04,&local_900);
              std::__cxx11::string::~string((string *)&local_900);
              std::allocator<char>::~allocator((allocator<char> *)((long)&cbpUnit + 7));
              local_8d9 = bVar6;
              if ((bVar6) &&
                 (lVar18 = std::__cxx11::string::find(local_8d8,0x1288bac), lVar18 != -1)) {
                tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x13;
              }
              else {
                if ((lang.field_2._M_local_buf[0xf] & 1U) != 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&cm,(value_type *)relative_1.field_2._8_8_);
                }
                pmVar20 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                        *)&cFiles.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (key_type *)relative_1.field_2._8_8_);
                local_910 = pmVar20;
                headerExts = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)std::
                                unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ::get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                       *)sources.
                                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                push_back(&pmVar20->Targets,(value_type *)&headerExts);
                tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
              }
              std::__cxx11::string::~string((string *)local_8d8);
              std::__cxx11::string::~string((string *)&srcext);
            }
            __gnu_cxx::
            __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&__end4);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_828);
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
        ::operator++(&__end2_3);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&__end1_2);
    }
    pcVar12 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    pvVar19 = cmake::GetHeaderExtensions_abi_cxx11_(pcVar12);
    __end1_3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cm);
    fileName_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cm);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&fileName_1), bVar6) {
      headerBasename.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_3);
      cmsys::SystemTools::GetFilenamePath(&local_980,(string *)headerBasename.field_2._8_8_);
      local_981 = '/';
      cmsys::SystemTools::GetFilenameWithoutExtension
                ((string *)&__range2_4,(string *)headerBasename.field_2._8_8_);
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                ((string *)local_960,&local_980,&local_981,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_4);
      std::__cxx11::string::~string((string *)&__range2_4);
      std::__cxx11::string::~string((string *)&local_980);
      __end2_4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar19);
      ext = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar19);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_4,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&ext), bVar6) {
        hname.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_4);
        local_9e9 = '.';
        cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                  ((string *)local_9e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_960,
                   &local_9e9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   hname.field_2._8_8_);
        local_9f8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     *)&cFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_9e8);
        __range1_4 = (all_files_map_t *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                            *)&cFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar6 = std::operator!=(&local_9f8,(_Self *)&__range1_4);
        if (bVar6) {
          tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x16;
        }
        else {
          bVar6 = cmsys::SystemTools::FileExists((string *)local_9e8);
          if (bVar6) {
            pmVar20 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)headerBasename.field_2._8_8_);
            this_05 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)local_9e8);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_05->Targets,&pmVar20->Targets);
            tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x16;
          }
          else {
            tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_9e8);
        if ((int)tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_4);
      }
      std::__cxx11::string::~string((string *)local_960);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_3);
    }
    ppbVar1 = &cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        *)ppbVar1);
    s_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    *)ppbVar1);
    while (bVar6 = std::operator!=(&__end1_4,(_Self *)&s_1), bVar6) {
      unit = (CbpUnit *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
             ::operator*(&__end1_4);
      local_a30 = &((reference)unit)->second;
      unitFilename = (string *)unit;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a50,"Unit",(allocator<char> *)((long)&__range2_5 + 7));
      cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_a50);
      std::__cxx11::string::~string((string *)&local_a50);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_5 + 7));
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_548,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit);
      this_01 = local_a30;
      __end2_5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(&local_a30->Targets);
      tgt = (cmGeneratorTarget *)
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                      (&this_01->Targets);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_5,
                                (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                 *)&tgt), bVar6) {
        ppcVar21 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                   ::operator*(&__end2_5);
        local_a78 = *ppcVar21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a98,"Option",&local_a99)
        ;
        cmXMLWriter::StartElement((cmXMLWriter *)local_548,&local_a98);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_a78);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_548,"target",psVar11);
        cmXMLWriter::EndElement((cmXMLWriter *)local_548);
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
        ::operator++(&__end2_5);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_548);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
      ::operator++(&__end1_4);
    }
    psVar11 = cmMakefile::GetHomeDirectory_abi_cxx11_((cmMakefile *)fout._608_8_);
    std::operator+(&local_ac0,psVar11,"/");
    Tree::BuildUnit((Tree *)&__range1,(cmXMLWriter *)local_548,&local_ac0);
    std::__cxx11::string::~string((string *)&local_ac0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    cmXMLWriter::EndElement((cmXMLWriter *)local_548);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_548);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cm);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
            *)&cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_548);
    std::__cxx11::string::~string((string *)&make);
    Tree::~Tree((Tree *)&__range1);
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  }
  else {
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (cmLocalGenerator* lg : it.second) {
      cm::append(listFiles, lg->GetMakefile()->GetListFiles());
    }

    // Convert
    for (std::string const& listFile : listFiles) {
      // don't put cmake's own files into the project (#12110):
      if (cmHasPrefix(listFile, cmSystemTools::GetCMakeRoot())) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it.second[0]->GetSourceDirectory(), listFile);
      std::vector<std::string> split;
      cmSystemTools::SplitPath(relative, split, false);
      // Split filename from path
      std::string fileName = *(split.end() - 1);
      split.erase(split.end() - 1, split.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      //
      // Also we can disable external (outside the project) files by setting ON
      // CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable.
      const bool excludeExternal = it.second[0]->GetMakefile()->IsOn(
        "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
      if (!split.empty() &&
          (!excludeExternal || (relative.find("..") == std::string::npos)) &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(split, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", nullptr, make, lgs[0], compiler, makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                               makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                             makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = target.get();
          this->AppendTarget(xml, targetName, gt, make, lg, compiler,
                             makeArgs);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(xml, fastTarget, gt, make, lg, compiler,
                             makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an accompanying header
  // that should be looked for.
  using all_files_map_t = std::map<std::string, CbpUnit>;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  auto* cm = this->GlobalGenerator->GetCMakeInstance();

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(
            sources, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* s : sources) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (target->GetType() == cmStateEnums::UTILITY &&
                s->GetIsGenerated()) {
              continue;
            }

            // check whether it is a C/C++/CUDA/HIP implementation file
            bool isCFile = false;
            std::string lang = s->GetOrDetermineLanguage();
            if (lang == "C" || lang == "CXX" || lang == "CUDA" ||
                lang == "HIP") {
              std::string const& srcext = s->GetExtension();
              isCFile = cm->IsACLikeSourceExtension(srcext);
            }

            std::string const& fullPath = s->ResolveFullPath();

            // Check file position relative to project root dir.
            const std::string relative =
              cmSystemTools::RelativePath(lg->GetSourceDirectory(), fullPath);
            // Do not add this file if it has ".." in relative path and
            // if CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable is on.
            const bool excludeExternal = lg->GetMakefile()->IsOn(
              "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
            if (excludeExternal &&
                (relative.find("..") != std::string::npos)) {
              continue;
            }

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(target.get());
          }
        } break;
        default:
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeLite
  // project generator.
  for (std::string const& fileName : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(fileName), '/',
               cmSystemTools::GetFilenameWithoutExtension(fileName));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (auto const& s : allFiles) {
    std::string const& unitFilename = s.first;
    CbpUnit const& unit = s.second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (cmGeneratorTarget const* tgt : unit.Targets) {
      xml.StartElement("Option");
      xml.Attribute("target", tgt->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, mf->GetHomeDirectory() + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}